

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-cpuid.c
# Opt level: O0

void cpuid_get_family_model(uint32_t *family,uint32_t *model)

{
  undefined1 local_28 [8];
  asm_cpuid_data cpudata;
  uint32_t *model_local;
  uint32_t *family_local;
  
  cpudata._8_8_ = model;
  if (family == (uint32_t *)0x0) {
    __assert_fail("family != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-cpuid.c"
                  ,0x30,"void cpuid_get_family_model(uint32_t *, uint32_t *)");
  }
  if (model != (uint32_t *)0x0) {
    asm_cpuid(1,(asm_cpuid_data *)local_28);
    *family = (uint)local_28._0_4_ >> 8 & 0xf | (uint)local_28._0_4_ >> 0x10 & 0xf0;
    *(uint *)cpudata._8_8_ = (uint)local_28._0_4_ >> 4 & 0xf | (uint)local_28._0_4_ >> 0xc & 0xf0;
    return;
  }
  __assert_fail("model != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-cpuid.c"
                ,0x31,"void cpuid_get_family_model(uint32_t *, uint32_t *)");
}

Assistant:

void cpuid_get_family_model(uint32_t* family, uint32_t* model) {
  assert(family != NULL);
  assert(model != NULL);
  asm_cpuid_data cpudata;
  asm_cpuid(1, &cpudata);
  // family | extended family (upper 4 bits only) -- must be "6"
  *family = ((cpudata.eax >> 8) & 0xF) | ((cpudata.eax >> 16) & 0xF0);
  // model | processor type (plus two more bits 14:15?)
  *model = ((cpudata.eax >> 4) & 0xF) | ((cpudata.eax >> 12) & 0xF0);
  raplcap_log(DEBUG, "cpuid_get_family_model: cpu_family=%02X, cpu_model=%02X\n", *family, *model);
}